

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O0

char * cmime_qp_decode(char *line_in,int mode,char esc_char)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *local_40;
  char *w;
  int orig_pos;
  int len;
  int ipos;
  int opos;
  char c;
  char *line_out;
  char esc_char_local;
  int mode_local;
  char *line_in_local;
  
  len = 0;
  sVar3 = strlen(line_in);
  iVar2 = (int)sVar3;
  sVar3 = strlen(line_in);
  pcVar4 = (char *)malloc(sVar3 + 1);
  orig_pos = 0;
  do {
    iVar1 = orig_pos;
    if (iVar2 <= orig_pos) {
LAB_0010d2a9:
      pcVar4[len] = '\0';
      return pcVar4;
    }
    ipos._3_1_ = line_in[orig_pos];
    if (ipos._3_1_ == esc_char) {
      if (iVar2 <= orig_pos + 2) {
        pcVar4[len] = '\0';
        goto LAB_0010d2a9;
      }
      local_40 = line_in + (orig_pos + 1);
      while( true ) {
        bVar5 = true;
        if (*local_40 != '\t') {
          bVar5 = *local_40 == ' ';
        }
        if (!bVar5) break;
        local_40 = local_40 + 1;
        orig_pos = orig_pos + 1;
      }
      if ((line_in[orig_pos + 1] != '\n') && (line_in[orig_pos + 1] != '\r')) {
        if (iVar1 < iVar2 + -1) {
          if ((hexconv[(int)line_in[iVar1 + 1]] == '\x14') ||
             (hexconv[(int)line_in[iVar1 + 2]] == '\x14')) {
            printf("invalid character for quoted-printable detected\n");
            orig_pos = iVar1;
          }
          else {
            ipos._3_1_ = hexconv[(int)line_in[iVar1 + 1]] * '\x10' +
                         hexconv[(int)line_in[iVar1 + 2]];
            orig_pos = iVar1 + 2;
          }
        }
        else {
          printf("no chars left!");
          orig_pos = iVar1;
        }
        goto LAB_0010d284;
      }
      iVar1 = orig_pos + 1;
      if ((orig_pos + 2 < iVar2) &&
         ((line_in[orig_pos + 2] == '\n' || (line_in[orig_pos + 2] == '\r')))) {
        iVar1 = orig_pos + 2;
      }
    }
    else {
      orig_pos = iVar1;
      if ((ipos._3_1_ == '_') && (mode == 1)) {
        ipos._3_1_ = ' ';
      }
LAB_0010d284:
      pcVar4[len] = ipos._3_1_;
      len = len + 1;
      iVar1 = orig_pos;
    }
    orig_pos = iVar1;
    orig_pos = orig_pos + 1;
  } while( true );
}

Assistant:

char *cmime_qp_decode(char *line_in, int mode, char esc_char)  {

    char *line_out = NULL;
    char c;                                                     /* output character */
    int opos = 0;                                               /* output positioning */
    int ipos;                                                   /* input positioning */
    int len = strlen(line_in);                                  /* length of inputstring */

    /* we malloc size of line_in char as through decoding string just can get shorter, not longer */
    line_out = malloc(strlen(line_in)+1*sizeof(char));

    /* we now go through every character of the string */                           
    for(ipos = 0; ipos < len; ipos++) {
        c = line_in[ipos];
   
        /* start cracking if we reach the esc char */
        if (c == esc_char) {
            /* check if there are to other chars */
            if((ipos+2)<len) {
                /* remember position */
                int orig_pos = ipos;
                
                /* absorb whitespaces */
                if (1) {
                    char *w = &(line_in[ipos +1]);
                    while ((*w == '\t') || (*w == ' ')) {w++;ipos++;}
                }

                /* check for linebreak */   
                if (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' )) {
                    ipos++;
                    if ((ipos+1 < len) && (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' ))) {
                        ipos++;
                    }
                    continue;
                } else {
                    /* go back to origin pos */
                    ipos = orig_pos;
                    /* convert char from hex to dec */
                    if(ipos < len - 1) {
                        if(hexconv[(int)line_in[ipos+1]] == 20 || hexconv[(int)line_in[ipos+2]] == 20) {
                            printf("invalid character for quoted-printable detected\n");
                        } else {
                            /* convert an skip 2 chars */
                            c = (char)hexconv[(int)line_in[ipos+1]]*16 + hexconv[(int)line_in[ipos+2]];
                            ipos+=2;
                        }
                    } else {
                        printf("no chars left!");
                    }
                }
            } else {
                    line_out[opos] = '\0';
                /* if we're out of chars, quit */
                break;
            }
        } else if (( c == '_') && (mode == DECODE_QP_MODE_ISO)) {
            /* RFC2047 says: if you encounter a '_' charactier in the ISO encoding then this must be converted to a space */
          c = ' ';
        }
        /* put in the new character, converted or not */
        line_out[opos] = c;
        opos++;
    }
    /* terminate string */
    line_out[opos]='\0';

    return line_out;
}